

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGenerator.cpp
# Opt level: O1

RandomGenerator * PyreNet::RandomGenerator::getInstance(void)

{
  RandomGenerator *pRVar1;
  ulong uVar2;
  default_random_engine *pdVar3;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lg;
  
  local_28 = (undefined1  [8])instanceMutex;
  lg._M_device._0_1_ = 0;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_28);
  lg._M_device._0_1_ = 1;
  if (randomGenerator == (RandomGenerator *)0x0) {
    pRVar1 = (RandomGenerator *)operator_new(8);
    uVar2 = std::chrono::_V2::system_clock::now();
    pdVar3 = (default_random_engine *)operator_new(8);
    pdVar3->_M_x = uVar2 % 0x7fffffff + (ulong)(uVar2 % 0x7fffffff == 0);
    pRVar1->generator = pdVar3;
    randomGenerator = pRVar1;
  }
  pRVar1 = randomGenerator;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return pRVar1;
}

Assistant:

RandomGenerator *RandomGenerator::getInstance() {
        std::unique_lock<std::mutex> lg(instanceMutex);
        if (randomGenerator == nullptr)
            randomGenerator = new RandomGenerator();
        return randomGenerator;
    }